

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_window_is_hovered(nk_context *ctx)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  nk_window *pnVar6;
  uint uVar7;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x4041,"int nk_window_is_hovered(struct nk_context *)");
  }
  pnVar6 = ctx->current;
  if (pnVar6 != (nk_window *)0x0) {
    uVar7 = 0;
    if ((pnVar6->flags & 0x2000) == 0) {
      uVar2 = (pnVar6->bounds).x;
      uVar4 = (pnVar6->bounds).y;
      fVar1 = (ctx->input).mouse.pos.x;
      if (((float)uVar2 <= fVar1) &&
         (uVar3 = (pnVar6->bounds).w, uVar5 = (pnVar6->bounds).h,
         fVar1 < (float)uVar2 + (float)uVar3)) {
        fVar1 = (ctx->input).mouse.pos.y;
        if ((float)uVar4 <= fVar1) {
          uVar7 = (uint)(fVar1 < (float)uVar4 + (float)uVar5);
        }
      }
    }
    return uVar7;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x4042,"int nk_window_is_hovered(struct nk_context *)");
}

Assistant:

NK_API int
nk_window_is_hovered(struct nk_context *ctx)
{
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current) return 0;
    if(ctx->current->flags & NK_WINDOW_HIDDEN)
        return 0;
    return nk_input_is_mouse_hovering_rect(&ctx->input, ctx->current->bounds);
}